

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O0

void __thiscall Clasp::ClaspVmtf::endInit(ClaspVmtf *this,Solver *s)

{
  LessLevel __comp;
  uint uVar1;
  ValueRep VVar2;
  bool bVar3;
  uint32 uVar4;
  Var VVar5;
  reference pVVar6;
  iterator puVar7;
  ClaspVmtf *this_00;
  Solver *in_RSI;
  long in_RDI;
  iterator it;
  Var v_1;
  VarVec vars;
  uint32 assumeNew;
  uint32 momsStamp;
  Var v;
  bool moms;
  Var in_stack_ffffffffffffff0c;
  Solver *in_stack_ffffffffffffff10;
  uint *in_stack_ffffffffffffff18;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  size_type n;
  ClaspVmtf *pCVar8;
  ClaspVmtf *in_stack_ffffffffffffff30;
  uint *in_stack_ffffffffffffff38;
  undefined4 uVar9;
  Var in_stack_ffffffffffffff4c;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffff50;
  uint32 in_stack_ffffffffffffff54;
  ClaspVmtf *local_58;
  LessLevel local_50;
  uint local_40;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  int local_20;
  uint32 local_1c;
  uint local_18;
  undefined1 local_11;
  Solver *local_10;
  
  local_10 = in_RSI;
  local_11 = Constraint_t::Set::inSet((Set *)(in_RDI + 0x34),Static);
  n = (size_type)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  if ((bool)local_11) {
    local_1c = *(int *)(in_RDI + 0x2c) + 1;
    uVar4 = Solver::numVars((Solver *)0x23560f);
    local_20 = (uVar4 - *(int *)(in_RDI + 0x3c)) + 1;
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pod_vector
              ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff30)
    ;
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff30,
               n);
    for (local_40 = 1; uVar1 = local_40, uVar4 = Solver::numVars((Solver *)0x235676), uVar1 <= uVar4
        ; local_40 = local_40 + 1) {
      VVar2 = Solver::value(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      if (VVar2 == '\0') {
        pVVar6 = bk_lib::
                 pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>::
                 operator[]((pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>
                             *)(in_RDI + 8),local_40);
        VarInfo::activity(pVVar6,*(uint32 *)(in_RDI + 0x2c));
        pVVar6 = bk_lib::
                 pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>::
                 operator[]((pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>
                             *)(in_RDI + 8),local_40);
        bVar3 = VarInfo::inList(pVVar6);
        if (!bVar3) {
          uVar4 = momsScore((Solver *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff4c);
          pVVar6 = bk_lib::
                   pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>
                   ::operator[]((pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>
                                 *)(in_RDI + 8),local_40);
          pVVar6->activity_ = uVar4;
          in_stack_ffffffffffffff54 = local_1c;
          pVVar6 = bk_lib::
                   pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>
                   ::operator[]((pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>
                                 *)(in_RDI + 8),local_40);
          pVVar6->decay_ = in_stack_ffffffffffffff54;
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        }
      }
    }
    puVar7 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&local_30);
    uVar9 = SUB84(puVar7,0);
    uVar10 = (undefined4)((ulong)puVar7 >> 0x20);
    puVar7 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&local_30);
    LessLevel::LessLevel(&local_50,local_10,(Score *)(in_RDI + 8));
    __comp.s_._4_4_ = uVar10;
    __comp.s_._0_4_ = uVar9;
    __comp.sc_._0_4_ = in_stack_ffffffffffffff50;
    __comp.sc_._4_4_ = in_stack_ffffffffffffff54;
    std::stable_sort<unsigned_int*,Clasp::ClaspVmtf::LessLevel>
              (puVar7,in_stack_ffffffffffffff38,__comp);
    local_58 = (ClaspVmtf *)
               bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&local_30);
    while (pCVar8 = local_58,
          this_00 = (ClaspVmtf *)
                    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&local_30),
          pCVar8 != this_00) {
      addToList(this_00,(Var)((ulong)pCVar8 >> 0x20));
      pVVar6 = bk_lib::
               pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>::
               operator[]((pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>
                           *)(in_RDI + 8),
                          *(size_type *)&(local_58->super_DecisionHeuristic)._vptr_DecisionHeuristic
                         );
      if (pVVar6->decay_ == local_1c) {
        pVVar6 = bk_lib::
                 pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>::
                 operator[]((pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>
                             *)(in_RDI + 8),
                            *(size_type *)
                             &(local_58->super_DecisionHeuristic)._vptr_DecisionHeuristic);
        pVVar6->activity_ = 0;
        uVar4 = *(uint32 *)(in_RDI + 0x2c);
        pVVar6 = bk_lib::
                 pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>::
                 operator[]((pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>
                             *)(in_RDI + 8),
                            *(size_type *)
                             &(local_58->super_DecisionHeuristic)._vptr_DecisionHeuristic);
        pVVar6->decay_ = uVar4;
      }
      local_58 = (ClaspVmtf *)
                 ((long)&(local_58->super_DecisionHeuristic)._vptr_DecisionHeuristic + 4);
    }
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::~pod_vector
              ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x23599e);
  }
  else {
    for (local_18 = 1; uVar1 = local_18, uVar4 = Solver::numVars((Solver *)0x23553f), uVar1 <= uVar4
        ; local_18 = local_18 + 1) {
      VVar2 = Solver::value(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      if (VVar2 == '\0') {
        pVVar6 = bk_lib::
                 pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>::
                 operator[]((pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>
                             *)(in_RDI + 8),local_18);
        VarInfo::activity(pVVar6,*(uint32 *)(in_RDI + 0x2c));
        pVVar6 = bk_lib::
                 pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>::
                 operator[]((pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>
                             *)(in_RDI + 8),local_18);
        bVar3 = VarInfo::inList(pVVar6);
        if (!bVar3) {
          addToList(in_stack_ffffffffffffff30,(Var)((ulong)in_stack_ffffffffffffff28 >> 0x20));
        }
      }
    }
  }
  VVar5 = getFront((ClaspVmtf *)0x2359ab);
  *(Var *)(in_RDI + 0x28) = VVar5;
  return;
}

Assistant:

void ClaspVmtf::endInit(Solver& s) {
	bool moms = types_.inSet(Constraint_t::Static);
	if (!moms) {
		// - add all new vars
		for (Var v = 1; v <= s.numVars(); ++v) {
			if (s.value(v) == value_free) {
				score_[v].activity(decay_);
				if (!score_[v].inList()) {
					addToList(v);
				}
			}
		}
	}
	else {
		// - set activity of all vars not in list to moms
		// - append new vars in moms-activity order
		const uint32 momsStamp = decay_ + 1;
		const uint32 assumeNew = (s.numVars() + 1) - nList_;
		VarVec vars;
		vars.reserve(assumeNew);
		for (Var v = 1; v <= s.numVars(); ++v) {
			if (s.value(v) == value_free) {
				score_[v].activity(decay_);
				if (!score_[v].inList()) {
					score_[v].activity_ = momsScore(s, v);
					score_[v].decay_    = momsStamp;
					vars.push_back(v);
				}
			}
		}
		std::stable_sort(vars.begin(), vars.end(), LessLevel(s, score_));
		for (VarVec::iterator it = vars.begin(); it != vars.end(); ++it) {
			addToList(*it);
			if (score_[*it].decay_ == momsStamp) {
				score_[*it].activity_ = 0;
				score_[*it].decay_    = decay_;
			}
		}
	}
	front_ = getFront();
}